

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void mine(defyx_vm *vm,atomic<unsigned_int> *atomicNonce,AtomicHash *result,uint32_t noncesCount,
         int thread,int cpuid)

{
  int i;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  uint8_t *puVar4;
  uint *puVar5;
  byte bVar6;
  uint64_t hash [4];
  uint8_t blockTemplate [76];
  ulong local_a8 [4];
  uint local_88 [9];
  uint local_61;
  undefined4 local_40;
  
  bVar6 = 0;
  if (-1 < cpuid) {
    local_88[0] = cpuid;
    iVar1 = set_thread_affinity(local_88);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to set thread affinity for thread ",0x29);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,thread);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," (error=",8);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  puVar4 = blockTemplate_;
  puVar5 = local_88;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)puVar5 = *(undefined8 *)puVar4;
    puVar4 = puVar4 + ((ulong)bVar6 * -2 + 1) * 8;
    puVar5 = puVar5 + ((ulong)bVar6 * -2 + 1) * 2;
  }
  local_40 = 0x961d561;
  LOCK();
  local_61 = (atomicNonce->super___atomic_base<unsigned_int>)._M_i;
  (atomicNonce->super___atomic_base<unsigned_int>)._M_i =
       (atomicNonce->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (local_61 < noncesCount) {
    do {
      defyx_calculate_hash(vm,local_88,0x4c,local_a8);
      lVar3 = 0;
      do {
        LOCK();
        result->hash[lVar3].super___atomic_base<unsigned_long>._M_i =
             result->hash[lVar3].super___atomic_base<unsigned_long>._M_i ^ local_a8[lVar3];
        UNLOCK();
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      LOCK();
      local_61 = (atomicNonce->super___atomic_base<unsigned_int>)._M_i;
      (atomicNonce->super___atomic_base<unsigned_int>)._M_i =
           (atomicNonce->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
    } while (local_61 < noncesCount);
  }
  return;
}

Assistant:

void mine(defyx_vm* vm, std::atomic<uint32_t>& atomicNonce, AtomicHash& result, uint32_t noncesCount, int thread, int cpuid=-1) {
	if (cpuid >= 0) {
		int rc = set_thread_affinity(cpuid);
		if (rc) {
			std::cerr << "Failed to set thread affinity for thread " << thread << " (error=" << rc << ")" <<  std::endl;
		}
	}
	uint64_t hash[RANDOMX_HASH_SIZE / sizeof(uint64_t)];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	void* noncePtr = blockTemplate + 39;
	auto nonce = atomicNonce.fetch_add(1);

	while (nonce < noncesCount) {
		store32(noncePtr, nonce);
		defyx_calculate_hash(vm, blockTemplate, sizeof(blockTemplate), &hash);
		result.xorWith(hash);
		nonce = atomicNonce.fetch_add(1);
	}
}